

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__read_uint16(ma_dr_flac_bs *bs,uint bitCount,ma_uint16 *pResult)

{
  ulong uVar1;
  bool bVar2;
  ma_bool32 mVar3;
  ulong uVar4;
  byte bVar5;
  ushort extraout_DX;
  ushort extraout_DX_00;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar4 = (ulong)bitCount;
  if (bs->consumedBits == 0x40) {
    mVar3 = ma_dr_flac__reload_cache(bs);
    if (mVar3 == 0) {
      bVar2 = true;
      uVar6 = extraout_DX;
      goto LAB_00168f1d;
    }
  }
  uVar7 = bs->consumedBits;
  uVar9 = 0x40 - (ulong)uVar7;
  if (uVar9 < uVar4) {
    uVar1 = bs->cache;
    mVar3 = ma_dr_flac__reload_cache(bs);
    bVar2 = true;
    uVar6 = extraout_DX_00;
    if (mVar3 == 0) goto LAB_00168f1d;
    bitCount = bitCount - (int)uVar9;
    uVar4 = (ulong)bitCount;
    uVar7 = bs->consumedBits;
    if (0x40 - (ulong)uVar7 < uVar4) goto LAB_00168f1d;
    bVar5 = (byte)bitCount;
    uVar8 = bs->cache;
    uVar6 = (ushort)((~(0xffffffffffffffffU >> (bVar5 & 0x3f)) & uVar8) >> (-bVar5 & 0x3f)) |
            (ushort)((int)((~(0xffffffffffffffffU >> ((byte)uVar9 & 0x3f)) & uVar1) >>
                          (-(byte)uVar9 & 0x3f)) << (bVar5 & 0x1f));
  }
  else {
    uVar8 = bs->cache;
    uVar6 = (ushort)((~(0xffffffffffffffffU >> ((byte)bitCount & 0x3f)) & uVar8) >>
                    (-(byte)bitCount & 0x3f));
  }
  bs->consumedBits = uVar7 + bitCount;
  bs->cache = uVar8 << ((byte)uVar4 & 0x3f);
  bVar2 = false;
LAB_00168f1d:
  if (!bVar2) {
    *pResult = uVar6;
  }
  return (uint)!bVar2;
}

Assistant:

static ma_bool32 ma_dr_flac__read_uint16(ma_dr_flac_bs* bs, unsigned int bitCount, ma_uint16* pResult)
{
    ma_uint32 result;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pResult != NULL);
    MA_DR_FLAC_ASSERT(bitCount > 0);
    MA_DR_FLAC_ASSERT(bitCount <= 16);
    if (!ma_dr_flac__read_uint32(bs, bitCount, &result)) {
        return MA_FALSE;
    }
    *pResult = (ma_uint16)result;
    return MA_TRUE;
}